

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

void __thiscall project::gen_cmake(project *this)

{
  project *this_00;
  ofstream outfile;
  
  get_cmake_file_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::ofstream::ofstream(&outfile,(string *)&stack0xfffffffffffffdd0,_S_bin);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_header_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_dependencies_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_cpp_standard_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_defines_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_include_dirs_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  this_00 = (project *)&stack0xfffffffffffffdd0;
  std::operator<<((ostream *)&outfile,(string *)this_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_autogen_vars_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this_00);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_resource_files_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_source_list_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_executable_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_common_options_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  get_target_config_abi_cxx11_((string *)&stack0xfffffffffffffdd0,this);
  std::operator<<((ostream *)&outfile,(string *)&stack0xfffffffffffffdd0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  return;
}

Assistant:

void project::gen_cmake()
{
    std::ofstream outfile (get_cmake_file(), std::ofstream::binary);

    outfile << get_header();
    outfile << get_dependencies();
    outfile << get_cpp_standard();
    outfile << get_defines();
    outfile << get_include_dirs();
    outfile << get_autogen_vars();
    outfile << get_resource_files();
    outfile << get_source_list();
    //outfile << get_source_groups();
    outfile << get_executable();
    outfile << get_common_options();
    outfile << get_target_config();

    outfile.close();
}